

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Index __thiscall wasm::Wasm2JSBuilder::getDataIndex(Wasm2JSBuilder *this,Name segment)

{
  iterator iVar1;
  undefined1 local_18 [8];
  Name segment_local;
  
  segment_local.super_IString.str._M_len = segment.super_IString.str._M_str;
  local_18 = segment.super_IString.str._M_len;
  iVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,(key_type *)local_18);
  if (iVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur !=
      (__node_type *)0x0) {
    return *(Index *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                            ._M_cur + 0x18);
  }
  __assert_fail("it != dataIndices.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                ,0xcb,"Index wasm::Wasm2JSBuilder::getDataIndex(Name)");
}

Assistant:

Index getDataIndex(Name segment) {
    auto it = dataIndices.find(segment);
    assert(it != dataIndices.end());
    return it->second;
  }